

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

ushort __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAddressIndex
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,void *objectAddress)

{
  code *pcVar1;
  bool bVar2;
  ushort uVar3;
  BOOL BVar4;
  char *pcVar5;
  undefined4 *puVar6;
  ushort index;
  uint offset;
  void *objectAddress_local;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_local;
  
  if ((this->super_HeapBlock).address <= objectAddress) {
    pcVar5 = GetEndAddress(this);
    if (objectAddress < pcVar5) goto LAB_008fa8ee;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                     ,0x227,"(objectAddress >= address && objectAddress < this->GetEndAddress())",
                     "objectAddress >= address && objectAddress < this->GetEndAddress()");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 0;
LAB_008fa8ee:
  BVar4 = HeapInfo::IsAlignedAddress(objectAddress);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x228,"(HeapInfo::IsAlignedAddress(objectAddress))",
                       "HeapInfo::IsAlignedAddress(objectAddress)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  BVar4 = HeapInfo::IsAlignedAddress((this->super_HeapBlock).address);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x229,"(HeapInfo::IsAlignedAddress(address))",
                       "HeapInfo::IsAlignedAddress(address)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar3 = ValidPointers<SmallAllocationBlockAttributes>::GetAddressIndex
                    (&this->validPointers,
                     (uint)((int)objectAddress - (int)(this->super_HeapBlock).address) >> 4);
  if ((uVar3 != 0xffff) && (0xff < uVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x230,
                       "(index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit || index <= TBlockAttributes::MaxAddressBit)"
                       ,
                       "index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit || index <= TBlockAttributes::MaxAddressBit"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return uVar3;
}

Assistant:

ushort
SmallHeapBlockT<TBlockAttributes>::GetAddressIndex(void * objectAddress)
{
    Assert(objectAddress >= address && objectAddress < this->GetEndAddress());
    Assert(HeapInfo::IsAlignedAddress(objectAddress));
    Assert(HeapInfo::IsAlignedAddress(address));

    unsigned int offset = (unsigned int)((char*)objectAddress - address);
    offset = offset >> HeapConstants::ObjectAllocationShift;

    ushort index = validPointers.GetAddressIndex(offset);
    Assert(index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit ||
        index <= TBlockAttributes::MaxAddressBit);
    return index;
}